

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.cpp
# Opt level: O1

void DumpFunction(Proto *f,DumpState *D)

{
  TValue *pTVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  DumpState *in_RCX;
  size_t sVar4;
  uint uVar5;
  lua_State *plVar6;
  TString *s;
  ulong uVar7;
  long lVar8;
  char x;
  undefined8 local_38;
  
  local_38._0_4_ = f->linedefined;
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar2;
  }
  local_38 = CONCAT44(local_38._4_4_,f->lastlinedefined);
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar2;
  }
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    local_38._0_1_ = f->numparams;
    iVar2 = (*D->writer)(D->L,&local_38,1,in_RCX);
    D->status = iVar2;
  }
  local_38._0_1_ = f->is_vararg;
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,1,in_RCX);
    D->status = iVar2;
  }
  local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,1,in_RCX);
    D->status = iVar2;
  }
  DumpVector(f->code,f->sizecode,(size_t)D,in_RCX);
  uVar5 = f->sizek;
  local_38 = CONCAT44(local_38._4_4_,uVar5);
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar2;
  }
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      pTVar1 = f->k;
      local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar1->tt_ + lVar8)) &
                 0xffffffffffffff0f;
      if (D->status == 0) {
        in_RCX = (DumpState *)D->data;
        iVar2 = (*D->writer)(D->L,&local_38,1,in_RCX);
        D->status = iVar2;
      }
      uVar3 = *(uint *)((long)&pTVar1->tt_ + lVar8) & 0xf;
      if (uVar3 == 4) {
        DumpString(*(TString **)((long)&pTVar1->value_ + lVar8),D);
      }
      else if (uVar3 == 3) {
        local_38 = *(ulong *)((long)&pTVar1->value_ + lVar8);
        if (D->status == 0) {
          plVar6 = D->L;
          in_RCX = (DumpState *)D->data;
          sVar4 = 8;
          goto LAB_001086d5;
        }
      }
      else if ((uVar3 == 1) &&
              (local_38 = CONCAT71(local_38._1_7_,*(undefined1 *)((long)&pTVar1->value_ + lVar8)),
              D->status == 0)) {
        plVar6 = D->L;
        in_RCX = (DumpState *)D->data;
        sVar4 = 1;
LAB_001086d5:
        iVar2 = (*D->writer)(plVar6,&local_38,sVar4,in_RCX);
        D->status = iVar2;
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar8);
  }
  uVar5 = f->sizep;
  local_38 = CONCAT44(local_38._4_4_,uVar5);
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar2;
  }
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      DumpFunction(f->p[uVar7],D);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  uVar5 = f->sizeupvalues;
  local_38 = CONCAT44(local_38._4_4_,uVar5);
  if (D->status == 0) {
    in_RCX = (DumpState *)D->data;
    iVar2 = (*D->writer)(D->L,&local_38,4,in_RCX);
    D->status = iVar2;
  }
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      if (D->status == 0) {
        in_RCX = (DumpState *)D->data;
        local_38._0_1_ = (&f->upvalues->instack)[lVar8];
        iVar2 = (*D->writer)(D->L,&local_38,1,in_RCX);
        D->status = iVar2;
      }
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->idx)[lVar8]);
      if (D->status == 0) {
        in_RCX = (DumpState *)D->data;
        iVar2 = (*D->writer)(D->L,&local_38,1,in_RCX);
        D->status = iVar2;
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar8);
  }
  iVar2 = 0;
  if (D->strip == 0) {
    s = f->source;
  }
  else {
    s = (TString *)0x0;
  }
  DumpString(s,D);
  if (D->strip == 0) {
    iVar2 = f->sizelineinfo;
  }
  DumpVector(f->lineinfo,iVar2,(size_t)D,in_RCX);
  uVar5 = 0;
  if (D->strip == 0) {
    uVar5 = f->sizelocvars;
  }
  local_38 = CONCAT44(local_38._4_4_,uVar5);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      DumpString(*(TString **)((long)&f->locvars->varname + lVar8),D);
      if (D->status == 0) {
        local_38._0_4_ = *(undefined4 *)((long)&f->locvars->startpc + lVar8);
        iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
        D->status = iVar2;
      }
      local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)((long)&f->locvars->endpc + lVar8));
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
        D->status = iVar2;
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar8);
  }
  uVar5 = 0;
  if (D->strip == 0) {
    uVar5 = f->sizeupvalues;
  }
  local_38 = CONCAT44(local_38._4_4_,uVar5);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,4,D->data);
    D->status = iVar2;
  }
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      DumpString(*(TString **)((long)&f->upvalues->name + lVar8),D);
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar8);
  }
  return;
}

Assistant:

static void DumpFunction(const Proto* f, DumpState* D)
{
 DumpInt(f->linedefined,D);
 DumpInt(f->lastlinedefined,D);
 DumpChar(f->numparams,D);
 DumpChar(f->is_vararg,D);
 DumpChar(f->maxstacksize,D);
 DumpCode(f,D);
 DumpConstants(f,D);
 DumpUpvalues(f,D);
 DumpDebug(f,D);
}